

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_node * troc_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  char *pcVar1;
  void *pvVar2;
  trt_type tVar3;
  trt_iffeatures tVar4;
  byte local_c9;
  char *local_c8;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_80 [10];
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined1 local_38;
  lyplg_ext_sprinter_tree_node_override *local_30;
  lyplg_ext_sprinter_tree_node_override *no;
  lysc_node *cn;
  trt_tree_ctx *tc_local;
  trt_parent_cache ca_local;
  
  ca_local._0_8_ = ca.last_list;
  tc_local = ca._0_8_;
  cn = (lysc_node *)tc;
  if ((tc != (trt_tree_ctx *)0x0) && (tc->cn != (lysc_node *)0x0)) {
    local_30 = tro_set_node_overr(tc->lysc_tree,tc->cn,'\x01',&tc->plugin_ctx);
    no = (lyplg_ext_sprinter_tree_node_override *)cn->name;
    local_90 = 0;
    local_88 = 0;
    memset(local_80,0,0x28);
    local_80[0] = 0;
    local_58 = 3;
    local_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_38 = 1;
    memcpy(__return_storage_ptr__,&local_90,0x60);
    pcVar1 = tro_flags2status(*(uint16_t *)((long)&no->flags + 2));
    __return_storage_ptr__->status = pcVar1;
    pcVar1 = troc_resolve_flags(*(uint16_t *)&no->flags,*(uint16_t *)((long)&no->flags + 2),local_30
                               );
    __return_storage_ptr__->flags = pcVar1;
    troc_resolve_node_opts
              (*(uint16_t *)&no->flags,*(uint16_t *)((long)&no->flags + 2),
               &(__return_storage_ptr__->name).type,&(__return_storage_ptr__->name).opts);
    if ((local_30 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
       (local_30->add_opts == (char *)0x0)) {
      local_c8 = (char *)0x0;
    }
    else {
      local_c8 = local_30->add_opts;
    }
    (__return_storage_ptr__->name).add_opts = local_c8;
    local_c9 = 0;
    if (((ulong)no->flags & 0x10) != 0) {
      local_c9 = ((ulong)no->flags & 0x2000000) != 0 ^ 0xff;
    }
    (__return_storage_ptr__->name).keys = local_c9 & 1;
    pcVar1 = troc_resolve_node_prefix((lysc_node *)no,(lysc_module *)cn->parent);
    (__return_storage_ptr__->name).module_prefix = pcVar1;
    (__return_storage_ptr__->name).str = no[2].add_opts;
    tVar3 = trop_resolve_type((lysp_node *)no[4].add_opts);
    *(ulong *)&__return_storage_ptr__->type = CONCAT44(uStack_9c,tVar3.type);
    (__return_storage_ptr__->type).str = tVar3.str;
    tVar4 = trop_resolve_iffeatures((lysp_node *)no[4].add_opts);
    *(ulong *)&__return_storage_ptr__->iffeatures = CONCAT44(uStack_ac,tVar4.type);
    (__return_storage_ptr__->iffeatures).str = tVar4.str;
    pvVar2 = tro_next_sibling(no,(trt_tree_ctx *)cn);
    __return_storage_ptr__->last_one = (pvVar2 != (void *)0x0 ^ 0xffU) & 1;
    return __return_storage_ptr__;
  }
  __assert_fail("tc && tc->cn",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xcf3,
                "struct trt_node troc_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
}

Assistant:

static struct trt_node
troc_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    (void) ca;
    const struct lysc_node *cn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->cn);

    no = tro_set_node_overr(tc->lysc_tree, tc->cn, 1, &tc->plugin_ctx);

    cn = tc->cn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = tro_flags2status(cn->flags);

    /* <flags> */
    ret.flags = troc_resolve_flags(cn->nodetype, cn->flags, no);

    /* set type of the node */
    troc_resolve_node_opts(cn->nodetype, cn->flags, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (cn->nodetype & LYS_LIST) && !(cn->flags & LYS_KEYLESS);

    /* <prefix> */
    ret.name.module_prefix = troc_resolve_node_prefix(cn, tc->cmod);

    /* set node's name */
    ret.name.str = cn->name;

    /* <type> */
    ret.type = trop_resolve_type(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(TRP_TREE_CTX_GET_LYSP_NODE(cn));

    ret.last_one = !tro_next_sibling(cn, tc);

    return ret;
}